

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O2

int exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
              (float lambda,long scores_first,long scores_last,long param_4,long param_5)

{
  float fVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  score_iterator local_48;
  score_iterator local_38;
  
  uVar6 = *(ulong *)(scores_first + 8);
  iVar2 = 1;
  if (uVar6 <= *(ulong *)(scores_last + 8)) {
    uVar4 = *(ulong *)(param_5 + 8);
    uVar7 = *(ulong *)(param_4 + 8);
    if (uVar7 <= uVar4) {
      uVar5 = (long)(*(ulong *)(scores_last + 8) - uVar6) >> 3;
      uVar8 = (long)(uVar4 - uVar7) >> 3;
      if (uVar5 != uVar8) {
        if (uVar8 < uVar5) {
          uVar5 = uVar8;
        }
        *(ulong *)(scores_last + 8) = uVar6 + uVar5 * 8;
        uVar4 = uVar5 * 8 + *(long *)(param_4 + 8);
        for (uVar6 = uVar4; uVar6 != *(ulong *)(param_5 + 8); uVar6 = uVar6 + 8) {
          *(undefined4 *)(uVar6 + 4) = 0;
        }
        *(ulong *)(param_5 + 8) = uVar4;
        uVar7 = *(ulong *)(param_4 + 8);
      }
      if (uVar4 != uVar7) {
        local_48._vptr_score_iterator =
             (_func_int **)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
        local_48._p = *(action_score **)(scores_first + 8);
        std::max_element<ACTION_SCORE::score_iterator>(&local_38,&local_48);
        fVar1 = (local_38._p)->score;
        lVar10 = *(long *)(param_4 + 8);
        fVar12 = 0.0;
        for (lVar9 = *(long *)(scores_first + 8);
            (lVar3 = *(long *)(param_5 + 8), lVar10 != lVar3 &&
            (lVar9 != *(long *)(scores_last + 8))); lVar9 = lVar9 + 8) {
          fVar11 = expf((*(float *)(lVar9 + 4) - fVar1) * lambda);
          fVar12 = fVar12 + fVar11;
          *(float *)(lVar10 + 4) = fVar11;
          lVar10 = lVar10 + 8;
        }
        for (lVar9 = *(long *)(param_4 + 8); lVar9 != lVar3; lVar9 = lVar9 + 8) {
          *(float *)(lVar9 + 4) = *(float *)(lVar9 + 4) / fVar12;
          lVar3 = *(long *)(param_5 + 8);
        }
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int generate_softmax(float lambda, InputIt scores_first, InputIt scores_last, std::input_iterator_tag /* scores_tag */, OutputIt pdf_first, OutputIt pdf_last, std::random_access_iterator_tag /* pdf_tag */)
  {
    if (scores_last < scores_first || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;

    size_t num_actions_scores = scores_last - scores_first;
    size_t num_actions_pdf = pdf_last - pdf_first;

    if (num_actions_scores != num_actions_pdf)
    {
      // fallback to the minimum
      scores_last = scores_first + ((std::min)(num_actions_scores, num_actions_pdf));
      OutputIt pdf_new_last = pdf_first + ((std::min)(num_actions_scores, num_actions_pdf));

      // zero out pdf
      for (OutputIt d = pdf_new_last; d != pdf_last; ++d)
        *d = 0;

      pdf_last = pdf_new_last;
    }

    if (pdf_last - pdf_first == 0)
      return E_EXPLORATION_BAD_RANGE;

    float norm = 0.;
    float max_score = *std::max_element(scores_first, scores_last);

    InputIt s = scores_first;
    for (OutputIt d = pdf_first; d != pdf_last && s != scores_last; ++d, ++s)
    {
      float prob = exp(lambda*(*s - max_score));
      norm += prob;

      *d = prob;
    }

    // normalize
    for (OutputIt d = pdf_first; d != pdf_last; ++d)
      *d /= norm;

    return S_EXPLORATION_OK;
  }